

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O1

bool __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::minReLeave(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *sel,int leave,
            number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *maxabs,bool polish)

{
  uint *puVar1;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar2;
  pointer pnVar3;
  undefined8 uVar4;
  int iVar5;
  Status SVar6;
  pointer pnVar7;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *to;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> local_218;
  cpp_dec_float<100U,_int,_void> local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_88;
  
  if (leave < 0) goto LAB_004866da;
  pSVar8 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pUVar2 = pSVar8->theFvec;
  pnVar3 = (pSVar8->theUBbound).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((pnVar3[(uint)leave].m_backend.fpclass == cpp_dec_float_NaN) ||
     (pnVar7 = (pSVar8->theLBbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     pnVar7[(uint)leave].m_backend.fpclass == cpp_dec_float_NaN)) {
LAB_00486611:
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)sel,0.0);
    if (polish) goto LAB_004866da;
    pnVar3 = (pUVar2->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[(uint)leave].m_backend;
    local_128.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((long)&pnVar3[(uint)leave].m_backend + 8);
    local_128.m_backend.data._M_elems._16_8_ = *(undefined8 *)((long)(pnVar3 + (uint)leave) + 0x10);
    local_128.m_backend.data._M_elems._24_8_ = *(undefined8 *)((long)(pnVar3 + (uint)leave) + 0x18);
    local_128.m_backend.data._M_elems._32_8_ = *(undefined8 *)((long)(pnVar3 + (uint)leave) + 0x20);
    local_128.m_backend.data._M_elems._40_8_ = *(undefined8 *)((long)(pnVar3 + (uint)leave) + 0x28);
    local_128.m_backend.data._M_elems._48_8_ = *(undefined8 *)((long)(pnVar3 + (uint)leave) + 0x30);
    local_128.m_backend.data._M_elems._56_8_ = *(undefined8 *)((long)(pnVar3 + (uint)leave) + 0x38);
    local_128.m_backend.exp = *(int *)((long)(pnVar3 + (uint)leave) + 0x40);
    local_128.m_backend.neg = *(bool *)((long)(pnVar3 + (uint)leave) + 0x44);
    local_128.m_backend._72_8_ = *(undefined8 *)((long)(pnVar3 + (uint)leave) + 0x48);
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::shiftLBbound((this->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver,leave,&local_128);
    pSVar8 = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    pnVar7 = (pUVar2->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar3 = pnVar7 + (uint)leave;
    uVar9 = *(uint *)&pnVar3->m_backend;
    uVar10 = *(uint *)((long)&pnVar3->m_backend + 4);
    uVar11 = *(uint *)((long)&pnVar3->m_backend + 8);
    uVar12 = *(uint *)((long)&pnVar3->m_backend + 0xc);
    uVar4 = pnVar7 + (uint)leave;
    uVar13 = *(uint *)(uVar4 + 0x10);
    uVar14 = *(uint *)(uVar4 + 0x14);
    uVar15 = *(uint *)(uVar4 + 0x18);
    uVar16 = *(uint *)(uVar4 + 0x1c);
    uVar4 = pnVar7 + (uint)leave;
    uVar17 = *(uint *)(uVar4 + 0x20);
    uVar18 = *(uint *)(uVar4 + 0x24);
    uVar19 = *(uint *)(uVar4 + 0x28);
    uVar20 = *(uint *)(uVar4 + 0x2c);
    uVar4 = pnVar7 + (uint)leave;
    uVar21 = *(uint *)(uVar4 + 0x30);
    uVar22 = *(uint *)(uVar4 + 0x34);
    uVar23 = *(uint *)(uVar4 + 0x38);
    uVar24 = *(uint *)(uVar4 + 0x3c);
    to = &local_178;
  }
  else {
    iVar5 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                      (&pnVar3[(uint)leave].m_backend,&pnVar7[(uint)leave].m_backend);
    if (iVar5 < 1) goto LAB_00486611;
    pnVar3 = (pUVar2->thedelta).
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_218.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[(uint)leave].m_backend.data;
    local_218.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar3[(uint)leave].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar3[(uint)leave].m_backend.data + 0x10);
    local_218.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_218.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar3[(uint)leave].m_backend.data + 0x20);
    local_218.data._M_elems._32_8_ = *(undefined8 *)puVar1;
    local_218.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar3[(uint)leave].m_backend.data + 0x30);
    local_218.data._M_elems._48_8_ = *(undefined8 *)puVar1;
    local_218.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
    local_218.exp = pnVar3[(uint)leave].m_backend.exp;
    local_218.neg = pnVar3[(uint)leave].m_backend.neg;
    local_218.fpclass = pnVar3[(uint)leave].m_backend.fpclass;
    local_218.prec_elem = pnVar3[(uint)leave].m_backend.prec_elem;
    local_1c8.fpclass = cpp_dec_float_finite;
    local_1c8.prec_elem = 0x10;
    local_1c8.data._M_elems[0] = 0;
    local_1c8.data._M_elems[1] = 0;
    local_1c8.data._M_elems[2] = 0;
    local_1c8.data._M_elems[3] = 0;
    local_1c8.data._M_elems[4] = 0;
    local_1c8.data._M_elems[5] = 0;
    local_1c8.data._M_elems[6] = 0;
    local_1c8.data._M_elems[7] = 0;
    local_1c8.data._M_elems[8] = 0;
    local_1c8.data._M_elems[9] = 0;
    local_1c8.data._M_elems[10] = 0;
    local_1c8.data._M_elems[0xb] = 0;
    local_1c8.data._M_elems[0xc] = 0;
    local_1c8.data._M_elems[0xd] = 0;
    local_1c8.data._M_elems._56_5_ = 0;
    local_1c8.data._M_elems[0xf]._1_3_ = 0;
    local_1c8.exp = 0;
    local_1c8.neg = false;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&local_1c8,&(this->fastDelta).m_backend,&maxabs->m_backend);
    if (((sel->m_backend).fpclass == cpp_dec_float_NaN) || (local_1c8.fpclass == cpp_dec_float_NaN))
    goto LAB_004866da;
    iVar5 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                      (&sel->m_backend,&local_1c8);
    if (iVar5 < 1) goto LAB_004866da;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)sel,0.0);
    if (polish) goto LAB_004866da;
    pSVar8 = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    SVar6 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::dualStatus(&pSVar8->
                          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ,(pSVar8->
                          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).theBaseId.data + (uint)leave);
    if (SVar6 == D_ON_BOTH) goto LAB_004866da;
    if (local_218.fpclass != cpp_dec_float_NaN) {
      local_1c8.fpclass = cpp_dec_float_finite;
      local_1c8.prec_elem = 0x10;
      local_1c8.data._M_elems[0] = 0;
      local_1c8.data._M_elems[1] = 0;
      local_1c8.data._M_elems[2] = 0;
      local_1c8.data._M_elems[3] = 0;
      local_1c8.data._M_elems[4] = 0;
      local_1c8.data._M_elems[5] = 0;
      local_1c8.data._M_elems[6] = 0;
      local_1c8.data._M_elems[7] = 0;
      local_1c8.data._M_elems[8] = 0;
      local_1c8.data._M_elems[9] = 0;
      local_1c8.data._M_elems[10] = 0;
      local_1c8.data._M_elems[0xb] = 0;
      local_1c8.data._M_elems[0xc] = 0;
      local_1c8.data._M_elems[0xd] = 0;
      local_1c8.data._M_elems._56_5_ = 0;
      local_1c8.data._M_elems[0xf]._1_3_ = 0;
      local_1c8.exp = 0;
      local_1c8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_1c8,0.0);
      iVar5 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                        (&local_218,&local_1c8);
      if (0 < iVar5) {
        pnVar3 = (pUVar2->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_88.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[(uint)leave].m_backend;
        local_88.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((long)&pnVar3[(uint)leave].m_backend + 8);
        local_88.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((long)(pnVar3 + (uint)leave) + 0x10);
        local_88.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((long)(pnVar3 + (uint)leave) + 0x18);
        local_88.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((long)(pnVar3 + (uint)leave) + 0x20);
        local_88.m_backend.data._M_elems._40_8_ =
             *(undefined8 *)((long)(pnVar3 + (uint)leave) + 0x28);
        local_88.m_backend.data._M_elems._48_8_ =
             *(undefined8 *)((long)(pnVar3 + (uint)leave) + 0x30);
        local_88.m_backend.data._M_elems._56_8_ =
             *(undefined8 *)((long)(pnVar3 + (uint)leave) + 0x38);
        local_88.m_backend.exp = *(int *)((long)(pnVar3 + (uint)leave) + 0x40);
        local_88.m_backend.neg = *(bool *)((long)(pnVar3 + (uint)leave) + 0x44);
        local_88.m_backend._72_8_ = *(undefined8 *)((long)(pnVar3 + (uint)leave) + 0x48);
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::shiftLBbound((this->
                       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).thesolver,leave,&local_88);
        goto LAB_004866da;
      }
    }
    pSVar8 = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    pnVar7 = (pUVar2->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar3 = pnVar7 + (uint)leave;
    uVar9 = *(uint *)&pnVar3->m_backend;
    uVar10 = *(uint *)((long)&pnVar3->m_backend + 4);
    uVar11 = *(uint *)((long)&pnVar3->m_backend + 8);
    uVar12 = *(uint *)((long)&pnVar3->m_backend + 0xc);
    uVar4 = pnVar7 + (uint)leave;
    uVar13 = *(uint *)(uVar4 + 0x10);
    uVar14 = *(uint *)(uVar4 + 0x14);
    uVar15 = *(uint *)(uVar4 + 0x18);
    uVar16 = *(uint *)(uVar4 + 0x1c);
    uVar4 = pnVar7 + (uint)leave;
    uVar17 = *(uint *)(uVar4 + 0x20);
    uVar18 = *(uint *)(uVar4 + 0x24);
    uVar19 = *(uint *)(uVar4 + 0x28);
    uVar20 = *(uint *)(uVar4 + 0x2c);
    uVar4 = pnVar7 + (uint)leave;
    uVar21 = *(uint *)(uVar4 + 0x30);
    uVar22 = *(uint *)(uVar4 + 0x34);
    uVar23 = *(uint *)(uVar4 + 0x38);
    uVar24 = *(uint *)(uVar4 + 0x3c);
    to = &local_d8;
  }
  (to->m_backend).data._M_elems[0xc] = uVar21;
  (to->m_backend).data._M_elems[0xd] = uVar22;
  (to->m_backend).data._M_elems[0xe] = uVar23;
  (to->m_backend).data._M_elems[0xf] = uVar24;
  (to->m_backend).data._M_elems[8] = uVar17;
  (to->m_backend).data._M_elems[9] = uVar18;
  (to->m_backend).data._M_elems[10] = uVar19;
  (to->m_backend).data._M_elems[0xb] = uVar20;
  (to->m_backend).data._M_elems[4] = uVar13;
  (to->m_backend).data._M_elems[5] = uVar14;
  (to->m_backend).data._M_elems[6] = uVar15;
  (to->m_backend).data._M_elems[7] = uVar16;
  (to->m_backend).data._M_elems[0] = uVar9;
  (to->m_backend).data._M_elems[1] = uVar10;
  (to->m_backend).data._M_elems[2] = uVar11;
  (to->m_backend).data._M_elems[3] = uVar12;
  (to->m_backend).exp = *(int *)((long)(pnVar7 + (uint)leave) + 0x40);
  (to->m_backend).neg = *(bool *)((long)(pnVar7 + (uint)leave) + 0x44);
  uVar4 = *(undefined8 *)((long)(pnVar7 + (uint)leave) + 0x48);
  (to->m_backend).fpclass = (int)uVar4;
  (to->m_backend).prec_elem = (int)((ulong)uVar4 >> 0x20);
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::shiftUBbound(pSVar8,leave,to);
LAB_004866da:
  return SUB41((uint)leave >> 0x1f,0);
}

Assistant:

bool SPxFastRT<R>::minReLeave(R& sel, int leave, R maxabs, bool polish)
{
   UpdateVector<R>& vec = this->thesolver->fVec();
   VectorBase<R>& low = this->thesolver->lbBound();
   VectorBase<R>& up = this->thesolver->ubBound();

   if(leave < 0)
      return true;

   if(up[leave] > low[leave])
   {
      R x = vec.delta()[leave];

      if(sel > fastDelta / maxabs)
      {
         sel = 0.0;

         if(!polish
               && this->thesolver->dualStatus(this->thesolver->baseId(leave)) != SPxBasisBase<R>::Desc::D_ON_BOTH)
            // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
         {
            if(x > 0.0)
               this->thesolver->shiftLBbound(leave, vec[leave]);
            else
               this->thesolver->shiftUBbound(leave, vec[leave]);
         }
      }
   }
   else
   {
      sel = 0.0;

      // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
      if(!polish)
      {
         this->thesolver->shiftLBbound(leave, vec[leave]);
         this->thesolver->shiftUBbound(leave, vec[leave]);
      }
   }

   return false;
}